

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateOptionalNN(Result *__return_storage_ptr__,ModelDescription *description)

{
  Rep *pRVar1;
  void **ppvVar2;
  long lVar3;
  undefined8 *puVar4;
  allocator<char> local_31;
  string local_30;
  
  pRVar1 = (description->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar2 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar2 = (void **)0x0;
  }
  lVar3 = 0;
  do {
    if ((long)(description->input_).super_RepeatedPtrFieldBase.current_size_ * 8 == lVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_30,
                 "At least one feature for a neural network must NOT be optional.",&local_31);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
      return __return_storage_ptr__;
    }
    puVar4 = *(undefined8 **)(*(long *)((long)ppvVar2 + lVar3) + 0x20);
    if (puVar4 == (undefined8 *)0x0) {
      puVar4 = &Specification::_FeatureType_default_instance_;
    }
    lVar3 = lVar3 + 8;
  } while (*(char *)(puVar4 + 2) != '\0');
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateOptionalNN(const Specification::ModelDescription& description) {
        // just need to check that not all inputs are optional
        bool hasNotOptional = false;
        for (const auto& input : description.input()) {
            if (!input.type().isoptional()) {
                hasNotOptional = true;
                break;
            }
        }
        if (!hasNotOptional) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "At least one feature for a neural network must NOT be optional.");
        }
        return Result();
    }